

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_shocking_grasp(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int *piVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_EDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  int to;
  int from;
  int iVar2;
  
  from = 0x32;
  std::min<int>((int *)&stack0xfffffffffffffff8,(int *)&stack0xffffffffffffffd0);
  to = 0;
  piVar1 = std::max<int>((int *)&stack0xffffffffffffffcc,(int *)&stack0xfffffffffffffff8);
  iVar2 = *piVar1;
  number_range(from,to);
  saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,iVar2),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)in_RCX >> 0x20),SUB81((ulong)in_RCX >> 0x18,0));
  return;
}

Assistant:

void spell_shocking_grasp(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const int dam_each[] =
	{
		0,  0,  0,  0,  16, 18, 20, 20, 25, 29, 33, 36, 39, 39, 39, 40, 40,
		41, 41, 42, 42, 43, 43, 44, 44, 45, 45, 46, 46, 47, 47, 48, 48, 49,
		49, 50, 50, 51, 51, 52, 52, 53, 53, 54, 54, 55, 55, 56, 56, 57, 57
	};

	int dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);

	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_LIGHTNING, true);
}